

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void regenerateIndices(void)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  vector<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_> triangles;
  allocator_type local_21;
  vector<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_> local_20;
  
  std::vector<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>::vector
            (&local_20,(ulong)(uint)((int)phi_n * (int)theta_n * 2),&local_21);
  uVar7 = CONCAT44(phi_n._4_4_,(int)phi_n);
  if (uVar7 == 0) {
    lVar6 = 0;
  }
  else {
    uVar4 = CONCAT44(theta_n._4_4_,(int)theta_n);
    uVar2 = 0;
    lVar6 = 0;
    do {
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        lVar5 = lVar6 * 0xc;
        uVar7 = 0;
        do {
          iVar8 = ((int)uVar4 + 1) * (int)uVar2;
          iVar1 = (int)uVar7;
          iVar10 = iVar1 + iVar8 + 1;
          iVar9 = iVar8 + (int)uVar4;
          iVar3 = iVar1 + iVar9 + 1;
          *(int *)((long)&(local_20.
                           super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar5) = iVar10;
          *(int *)((long)&(local_20.
                           super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar5 + 4) =
               iVar1 + iVar8;
          *(int *)((long)&(local_20.
                           super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar5 + 8) = iVar3;
          lVar6 = lVar6 + 2;
          *(int *)((long)&local_20.
                          super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].field_0 + lVar5) = iVar3;
          *(int *)((long)&local_20.
                          super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].field_0 + lVar5 + 4) =
               iVar1 + 2 + iVar9;
          *(int *)((long)&local_20.
                          super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].field_0 + lVar5 + 8) = iVar10
          ;
          uVar7 = uVar7 + 1;
          uVar4 = CONCAT44(theta_n._4_4_,(int)theta_n);
          lVar5 = lVar5 + 0x18;
        } while (uVar7 < uVar4);
        uVar7 = CONCAT44(phi_n._4_4_,(int)phi_n);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar7);
  }
  (*__glewBufferData)(0x8893,lVar6 * 0xc,
                      local_20.
                      super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,0x88e8);
  index_count = lVar6 * 3;
  if (local_20.
      super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.
                    super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void regenerateIndices() {
    Perf stat("Regenerate indices");
    size_t n = 0;
    vector<ivec3> triangles(uint(phi_n * theta_n * 2));
    for (int phi_i = 0; phi_i < phi_n; phi_i++) {
        for (int theta_i = 0; theta_i < theta_n; theta_i++) {
            int tl = phi_i * (theta_n + 1) + theta_i;
            int tr = tl + 1;
            int bl = tr + theta_n;
            int br = bl + 1;
            triangles[n++] = ivec3(tr, tl, bl);
            triangles[n++] = ivec3(bl, br, tr);
        }
    }

    glBufferData(GL_ELEMENT_ARRAY_BUFFER, n * sizeof(ivec3), &triangles[0], GL_DYNAMIC_DRAW);

    index_count = n * 3;
}